

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddInputCharacterUTF16(ImGuiIO *this,ImWchar16 c)

{
  ImWchar16 IVar1;
  ImWchar cp;
  unsigned_short local_16;
  unsigned_short local_14;
  unsigned_short local_12;
  
  IVar1 = this->InputQueueSurrogate;
  if (c != 0 || IVar1 != 0) {
    if ((c & 0xfc00) == 0xd800) {
      if (IVar1 != 0) {
        ImVector<unsigned_short>::push_back(&this->InputQueueCharacters,&local_12);
      }
      this->InputQueueSurrogate = c;
    }
    else {
      if (IVar1 != 0) {
        if ((c & 0xfc00) != 0xdc00) {
          ImVector<unsigned_short>::push_back(&this->InputQueueCharacters,&local_14);
        }
        this->InputQueueSurrogate = 0;
      }
      ImVector<unsigned_short>::push_back(&this->InputQueueCharacters,&local_16);
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacterUTF16(ImWchar16 c)
{
    if (c == 0 && InputQueueSurrogate == 0)
        return;

    if ((c & 0xFC00) == 0xD800) // High surrogate, must save
    {
        if (InputQueueSurrogate != 0)
            InputQueueCharacters.push_back(IM_UNICODE_CODEPOINT_INVALID);
        InputQueueSurrogate = c;
        return;
    }

    ImWchar cp = c;
    if (InputQueueSurrogate != 0)
    {
        if ((c & 0xFC00) != 0xDC00) // Invalid low surrogate
            InputQueueCharacters.push_back(IM_UNICODE_CODEPOINT_INVALID);
        else if (IM_UNICODE_CODEPOINT_MAX == (0xFFFF)) // Codepoint will not fit in ImWchar (extra parenthesis around 0xFFFF somehow fixes -Wunreachable-code with Clang)
            cp = IM_UNICODE_CODEPOINT_INVALID;
        else
            cp = (ImWchar)(((InputQueueSurrogate - 0xD800) << 10) + (c - 0xDC00) + 0x10000);
        InputQueueSurrogate = 0;
    }
    InputQueueCharacters.push_back(cp);
}